

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O0

bool __thiscall brynet::net::DataSocket::onEnterEventLoop(DataSocket *this,PTR *eventLoop)

{
  bool bVar1;
  sock sVar2;
  element_type *peVar3;
  pointer pTVar4;
  PTR *eventLoop_local;
  DataSocket *this_local;
  
  peVar3 = std::
           __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)eventLoop);
  bVar1 = EventLoop::isInLoopThread(peVar3);
  if (!bVar1) {
    __assert_fail("eventLoop->isInLoopThread()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                  ,0x48,"bool brynet::net::DataSocket::onEnterEventLoop(const EventLoop::PTR &)");
  }
  peVar3 = std::
           __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)eventLoop);
  bVar1 = EventLoop::isInLoopThread(peVar3);
  if (bVar1) {
    bVar1 = std::operator==(&this->mEventLoop,(nullptr_t)0x0);
    if (!bVar1) {
      __assert_fail("mEventLoop == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                    ,0x4d,"bool brynet::net::DataSocket::onEnterEventLoop(const EventLoop::PTR &)");
    }
    bVar1 = std::operator!=(&this->mEventLoop,(nullptr_t)0x0);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      std::shared_ptr<brynet::net::EventLoop>::operator=(&this->mEventLoop,eventLoop);
      pTVar4 = std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::
               operator->(&this->mSocket);
      sVar2 = TcpSocket::getFD(pTVar4);
      bVar1 = base::SocketNonblock(sVar2);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mEventLoop);
        pTVar4 = std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>::
                 operator->(&this->mSocket);
        sVar2 = TcpSocket::getFD(pTVar4);
        bVar1 = EventLoop::linkChannel(peVar3,sVar2,&this->super_Channel);
        if (bVar1) {
          bVar1 = checkRead(this);
          if (bVar1) {
            bVar1 = std::operator!=(&this->mEnterCallback,(nullptr_t)0x0);
            if (bVar1) {
              std::function<void_(brynet::net::DataSocket_*)>::operator()
                        (&this->mEnterCallback,this);
              std::function<void_(brynet::net::DataSocket_*)>::operator=
                        (&this->mEnterCallback,(nullptr_t)0x0);
            }
            this_local._7_1_ = true;
          }
          else {
            closeSocket(this);
            this_local._7_1_ = false;
          }
        }
        else {
          closeSocket(this);
          this_local._7_1_ = false;
        }
      }
      else {
        closeSocket(this);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DataSocket::onEnterEventLoop(const EventLoop::PTR& eventLoop)
{
    assert(eventLoop->isInLoopThread());
    if (!eventLoop->isInLoopThread())
    {
        return false;
    }
    assert(mEventLoop == nullptr);
    if (mEventLoop != nullptr)
    {
        return false;
    }

    mEventLoop = eventLoop;

    if (!brynet::net::base::SocketNonblock(mSocket->getFD()))
    {
        closeSocket();
        return false;
    }
    if (!mEventLoop->linkChannel(mSocket->getFD(), this))
    {
        closeSocket();
        return false;
    }

#ifdef USE_OPENSSL
    if (mSSL != nullptr)
    {
        processSSLHandshake();
        return true;
    }
#endif

    if (!checkRead())
    {
        closeSocket();
        return false;
    }

    if (mEnterCallback != nullptr)
    {
        mEnterCallback(this);
        mEnterCallback = nullptr;
    }

    return true;
}